

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<unsigned_int> *
wasm::WATParser::maybeLabelidx<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx,bool inDelegate)

{
  ParseDefsCtx *pPVar1;
  bool bVar2;
  uint *puVar3;
  Name *pNVar4;
  Result<unsigned_int> local_a0;
  undefined1 local_78 [8];
  optional<wasm::Name> id;
  Result<unsigned_int> local_50;
  _Optional_payload_base<unsigned_int> local_24;
  optional<unsigned_int> x;
  bool inDelegate_local;
  ParseDefsCtx *ctx_local;
  
  x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value._3_1_ = inDelegate;
  unique0x100001e4 = ctx;
  local_24 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_24);
  pPVar1 = stack0xffffffffffffffe8;
  if (bVar2) {
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_24);
    ParseDefsCtx::getLabelFromIdx
              (&local_50,pPVar1,*puVar3,
               (bool)(x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>._M_payload._M_value._3_1_ & 1));
    MaybeResult<unsigned_int>::MaybeResult<unsigned_int>(__return_storage_ptr__,&local_50);
    Result<unsigned_int>::~Result(&local_50);
  }
  else {
    Lexer::takeID((optional<wasm::Name> *)local_78,&stack0xffffffffffffffe8->in);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_78);
    pPVar1 = stack0xffffffffffffffe8;
    if (bVar2) {
      pNVar4 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_78);
      ParseDefsCtx::getLabelFromName
                (&local_a0,pPVar1,(Name)(pNVar4->super_IString).str,
                 (bool)(x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload._M_value._3_1_ & 1));
      MaybeResult<unsigned_int>::MaybeResult<unsigned_int>(__return_storage_ptr__,&local_a0);
      Result<unsigned_int>::~Result(&local_a0);
    }
    else {
      MaybeResult<unsigned_int>::MaybeResult(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::LabelIdxT> maybeLabelidx(Ctx& ctx, bool inDelegate) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getLabelFromIdx(*x, inDelegate);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getLabelFromName(*id, inDelegate);
  }
  return {};
}